

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

size_t __thiscall
google::protobuf::compiler::CodeGeneratorRequest::ByteSizeLong(CodeGeneratorRequest *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  size_t sVar4;
  reference value_00;
  uint32_t *puVar5;
  string *value_01;
  FileDescriptorProto *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *__range2;
  int local_20;
  int n;
  int i;
  uint32_t cached_has_bits;
  size_t total_size;
  CodeGeneratorRequest *this_local;
  
  iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(&this->file_to_generate_);
  _i = internal::FromIntSize(iVar3);
  local_20 = 0;
  iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(&this->file_to_generate_);
  for (; local_20 < iVar3; local_20 = local_20 + 1) {
    value = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Get(&this->file_to_generate_,local_20);
    sVar4 = internal::WireFormatLite::StringSize(value);
    _i = sVar4 + _i;
  }
  iVar3 = _internal_proto_file_size(this);
  _i = (long)iVar3 + _i;
  __end2 = RepeatedPtrField<google::protobuf::FileDescriptorProto>::begin(&this->proto_file_);
  msg = (FileDescriptorProto *)
        RepeatedPtrField<google::protobuf::FileDescriptorProto>::end(&this->proto_file_);
  while (bVar2 = internal::RepeatedPtrIterator<const_google::protobuf::FileDescriptorProto>::
                 operator!=(&__end2,(iterator *)&msg), bVar2) {
    value_00 = internal::RepeatedPtrIterator<const_google::protobuf::FileDescriptorProto>::operator*
                         (&__end2);
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::FileDescriptorProto>(value_00);
    _i = sVar4 + _i;
    internal::RepeatedPtrIterator<const_google::protobuf::FileDescriptorProto>::operator++(&__end2);
  }
  puVar5 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
  uVar1 = *puVar5;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      value_01 = _internal_parameter_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(value_01);
      _i = sVar4 + 1 + _i;
    }
    if ((uVar1 & 2) != 0) {
      sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::compiler::Version>
                        (this->compiler_version_);
      _i = sVar4 + 1 + _i;
    }
  }
  sVar4 = Message::MaybeComputeUnknownFieldsSize(&this->super_Message,_i,&this->_cached_size_);
  return sVar4;
}

Assistant:

size_t CodeGeneratorRequest::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.compiler.CodeGeneratorRequest)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated string file_to_generate = 1;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(file_to_generate_.size());
  for (int i = 0, n = file_to_generate_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      file_to_generate_.Get(i));
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  total_size += 1UL * this->_internal_proto_file_size();
  for (const auto& msg : this->proto_file_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    // optional string parameter = 2;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_parameter());
    }

    // optional .google.protobuf.compiler.Version compiler_version = 3;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *compiler_version_);
    }

  }
  return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);
}